

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O3

LY_ERR lyplg_type_store_bits
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  byte *pbVar1;
  uint uVar2;
  lysc_type_bitenum_item *plVar3;
  int iVar4;
  LY_ERR LVar5;
  size_t sVar6;
  void *pvVar7;
  ushort **ppuVar8;
  ulong uVar9;
  ulong uVar10;
  long *plVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  storage->realtype = type;
  if (format == LY_VALUE_LYB) {
    sVar6 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
    if (sVar6 == value_len) {
      if ((options & 1) == 0) {
        pvVar7 = malloc(value_len);
        (storage->field_2).dyn_mem = pvVar7;
        if (pvVar7 == (void *)0x0) {
          LVar5 = LY_EMEM;
          goto LAB_001b90b8;
        }
        memcpy(pvVar7,value,value_len);
      }
      else {
        (storage->field_2).dyn_mem = value;
        options = 0;
      }
      lVar17 = *(long *)((long)&storage->field_2 + 8);
      if (lVar17 == 0) {
        if (type[1].name == (char *)0x0) {
          sVar14 = 8;
        }
        else {
          sVar14 = *(long *)(type[1].name + -8) * 8 + 8;
        }
        plVar11 = (long *)calloc(1,sVar14);
        if (plVar11 == (long *)0x0) goto LAB_001b9094;
        lVar17 = 0;
      }
      else {
        if (type[1].name == (char *)0x0) {
          lVar13 = 0;
        }
        else {
          lVar13 = *(long *)(type[1].name + -8);
        }
        plVar11 = (long *)realloc((void *)(lVar17 + -8),(lVar13 + *(long *)(lVar17 + -8)) * 8 + 8);
        if (plVar11 == (long *)0x0) {
LAB_001b9094:
          LVar5 = LY_EMEM;
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyplg_type_store_bits");
          goto LAB_001b90b8;
        }
        lVar17 = *plVar11;
      }
      *(long **)((long)&storage->field_2 + 8) = plVar11 + 1;
      LVar5 = LY_SUCCESS;
      if (type[1].name == (char *)0x0) {
        sVar14 = 0;
      }
      else {
        sVar14 = *(long *)(type[1].name + -8) << 3;
      }
      memset(plVar11 + lVar17 + 1,0,sVar14);
      bits_bitmap2items((char *)(storage->field_2).enum_item,(lysc_type_bits *)type,
                        (lysc_type_bitenum_item **)(plVar11 + 1));
    }
    else {
      sVar6 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
      LVar5 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                         "Invalid LYB bits value size %zu (expected %zu).",value_len,sVar6);
    }
  }
  else {
    LVar5 = lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
    if (LVar5 == LY_SUCCESS) {
      sVar6 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
      pvVar7 = malloc(sVar6);
      (storage->field_2).dyn_mem = pvVar7;
      if (pvVar7 != (void *)0x0) {
        sVar6 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
        memset(pvVar7,0,sVar6);
        if (value_len != 0) {
          plVar3 = (storage->field_2).enum_item;
          uVar9 = 0;
          ppuVar8 = __ctype_b_loc();
          do {
            uVar15 = uVar9 + 1;
            if (uVar9 + 1 < value_len) {
              uVar15 = value_len;
            }
            do {
              uVar10 = uVar9;
              if ((*(byte *)((long)*ppuVar8 + (long)*(char *)((long)value + uVar9) * 2 + 1) & 0x20)
                  == 0) break;
              uVar9 = uVar9 + 1;
              uVar10 = uVar15;
            } while (uVar15 != uVar9);
            if (uVar10 == value_len) break;
            uVar9 = uVar10;
            uVar15 = uVar10;
            if (uVar10 < value_len) {
              do {
                uVar9 = uVar15;
                if ((*(byte *)((long)*ppuVar8 + (long)*(char *)((long)value + uVar15) * 2 + 1) &
                    0x20) != 0) break;
                uVar15 = uVar15 + 1;
                uVar9 = value_len;
              } while (value_len != uVar15);
            }
            sVar6 = uVar9 - uVar10;
            lVar17 = 0;
            uVar15 = 0;
            while( true ) {
              pcVar16 = type[1].name;
              if (pcVar16 == (char *)0x0) {
                uVar12 = 0;
              }
              else {
                uVar12 = *(ulong *)(pcVar16 + -8);
              }
              if (uVar12 <= uVar15) {
                pcVar16 = "Invalid bit \"%.*s\".";
                goto LAB_001b8f2f;
              }
              iVar4 = ly_strncmp(*(char **)(pcVar16 + lVar17),(char *)((long)value + uVar10),sVar6);
              if (iVar4 == 0) break;
              uVar15 = uVar15 + 1;
              lVar17 = lVar17 + 0x28;
            }
            lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
            uVar2 = *(uint *)(type[1].name + lVar17 + 0x20);
            if (((0x1000000 << ((byte)uVar2 & 7)) >> 0x18 &
                (int)*(char *)((long)&plVar3->name + (ulong)(uVar2 >> 3))) != 0) {
              pcVar16 = "Duplicate bit \"%s\".";
              sVar6 = *(size_t *)(type[1].name + lVar17);
LAB_001b8f2f:
              LVar5 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,pcVar16,sVar6);
              if (LVar5 != LY_SUCCESS) goto LAB_001b90b8;
              break;
            }
            lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
            pbVar1 = (byte *)((long)&plVar3->name +
                             (ulong)(*(uint *)(type[1].name + lVar17 + 0x20) >> 3));
            *pbVar1 = *pbVar1 | (byte)(1 << ((byte)*(uint *)(type[1].name + lVar17 + 0x20) & 7));
          } while (uVar9 < value_len);
        }
        lVar17 = *(long *)((long)&storage->field_2 + 8);
        if (lVar17 == 0) {
          if (type[1].name == (char *)0x0) {
            sVar14 = 8;
          }
          else {
            sVar14 = *(long *)(type[1].name + -8) * 8 + 8;
          }
          plVar11 = (long *)calloc(1,sVar14);
          if (plVar11 != (long *)0x0) {
            lVar17 = 0;
            goto LAB_001b906e;
          }
        }
        else {
          if (type[1].name == (char *)0x0) {
            lVar13 = 0;
          }
          else {
            lVar13 = *(long *)(type[1].name + -8);
          }
          plVar11 = (long *)realloc((void *)(lVar17 + -8),(lVar13 + *(long *)(lVar17 + -8)) * 8 + 8)
          ;
          if (plVar11 != (long *)0x0) {
            lVar17 = *plVar11;
LAB_001b906e:
            *(long **)((long)&storage->field_2 + 8) = plVar11 + 1;
            LVar5 = LY_SUCCESS;
            if (type[1].name == (char *)0x0) {
              sVar14 = 0;
            }
            else {
              sVar14 = *(long *)(type[1].name + -8) << 3;
            }
            memset(plVar11 + lVar17 + 1,0,sVar14);
            bits_bitmap2items((char *)(storage->field_2).enum_item,(lysc_type_bits *)type,
                              (lysc_type_bitenum_item **)(plVar11 + 1));
            if (format == LY_VALUE_CANON) {
              if ((options & 1) != 0) {
                LVar5 = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
                goto LAB_001b90c6;
              }
              pcVar16 = "";
              if (value_len != 0) {
                pcVar16 = (char *)value;
              }
              LVar5 = lydict_insert(ctx,pcVar16,value_len,&storage->_canonical);
            }
            goto LAB_001b90b8;
          }
        }
        goto LAB_001b9094;
      }
      LVar5 = LY_EMEM;
    }
  }
LAB_001b90b8:
  if ((options & 1) != 0) {
    free(value);
  }
LAB_001b90c6:
  if (LVar5 != LY_SUCCESS) {
    lyplg_type_free_bits(ctx,storage);
  }
  return LVar5;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_store_bits(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type_bits *type_bits = (struct lysc_type_bits *)type;
    struct lyd_value_bits *val;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len != lyplg_type_bits_bitmap_size(type_bits)) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB bits value size %zu (expected %zu).",
                    value_len, lyplg_type_bits_bitmap_size(type_bits));
            goto cleanup;
        }

        /* store value (bitmap) */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            val->bitmap = (char *)value;
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
        } else {
            val->bitmap = malloc(value_len);
            LY_CHECK_ERR_GOTO(!val->bitmap, ret = LY_EMEM, cleanup);
            memcpy(val->bitmap, value, value_len);
        }

        /* allocate and fill the bit item array */
        LY_ARRAY_CREATE_GOTO(ctx, val->items, LY_ARRAY_COUNT(type_bits->bits), ret, cleanup);
        bits_bitmap2items(val->bitmap, type_bits, val->items);

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* allocate the bitmap */
    val->bitmap = malloc(lyplg_type_bits_bitmap_size(type_bits));
    LY_CHECK_ERR_GOTO(!val->bitmap, ret = LY_EMEM, cleanup);
    memset(val->bitmap, 0, lyplg_type_bits_bitmap_size(type_bits));

    /* fill the bitmap */
    ret = bits_str2bitmap(value, value_len, type_bits, val->bitmap, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* allocate and fill the bit item array */
    LY_ARRAY_CREATE_GOTO(ctx, val->items, LY_ARRAY_COUNT(type_bits->bits), ret, cleanup);
    bits_bitmap2items(val->bitmap, type_bits, val->items);

    if (format == LY_VALUE_CANON) {
        /* store canonical value */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value_len ? value : "", value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret != LY_SUCCESS, cleanup);
        }
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_bits(ctx, storage);
    }
    return ret;
}